

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestSubcase.hpp
# Opt level: O0

SubcaseBasePtr
deqp::TestSubcase::
Create<glcts::(anonymous_namespace)::CBufferIndirectDrawElementsNoFirstIndex<glcts::(anonymous_namespace)::test_api::ES3>>
          (void)

{
  CBufferIndirectDrawElementsNoFirstIndex<glcts::(anonymous_namespace)::test_api::ES3> *this;
  SharedPtrStateBase *extraout_RDX;
  SharedPtr<deqp::SubcaseBase> *in_RDI;
  SubcaseBasePtr SVar1;
  
  this = (CBufferIndirectDrawElementsNoFirstIndex<glcts::(anonymous_namespace)::test_api::ES3> *)
         operator_new(0x40);
  this->_buffer = 0;
  this->_bufferIndirect = 0;
  *(undefined8 *)&this->_ebo = 0;
  (this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context = (Context *)0x0;
  this->_program = 0;
  this->_vao = 0;
  (this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper.m_log =
       (TestLog *)0x0;
  *(undefined8 *)
   &(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper.
    m_enableLog = 0;
  (this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper =
       (_func_int **)0x0;
  (this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper.m_gl =
       (Functions *)0x0;
  glcts::anon_unknown_0::
  CBufferIndirectDrawElementsNoFirstIndex<glcts::(anonymous_namespace)::test_api::ES3>::
  CBufferIndirectDrawElementsNoFirstIndex(this);
  de::SharedPtr<deqp::SubcaseBase>::SharedPtr(in_RDI,(SubcaseBase *)this);
  SVar1.m_state = extraout_RDX;
  SVar1.m_ptr = (SubcaseBase *)in_RDI;
  return SVar1;
}

Assistant:

static SubcaseBase::SubcaseBasePtr Create()
	{
		return SubcaseBase::SubcaseBasePtr(new Type());
	}